

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::TupleValue::SerializeWithCachedSizes
          (TupleValue *this,CodedOutputStream *output)

{
  int iVar1;
  Type *value;
  int index;
  
  iVar1 = (this->values_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Value>::TypeHandler>
                      (&(this->values_).super_RepeatedPtrFieldBase,index);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  return;
}

Assistant:

void TupleValue::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.TupleValue)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.MILSpec.Value values = 1;
  for (unsigned int i = 0, n = this->values_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->values(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.TupleValue)
}